

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall libchars::command_cursor::next(command_cursor *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  reference ppcVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  double __x;
  double in_XMM1_Qa;
  undefined1 local_40 [8];
  string rstr;
  command_node *n;
  command_cursor *this_local;
  
  rstr.field_2._8_8_ = current(this);
  if ((command_node *)rstr.field_2._8_8_ == (command_node *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    remainder_abi_cxx11_((command_cursor *)local_40,__x,in_XMM1_Qa);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((string *)&this->w);
      lVar3 = std::__cxx11::string::length();
      this->idx = lVar3 + this->idx;
      this_local._7_1_ = true;
    }
    else if (*(long *)(rstr.field_2._8_8_ + 0x38) == 0) {
      while( true ) {
        bVar1 = std::
                stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
                ::empty(&this->S);
        bVar7 = false;
        if ((!bVar1) && (bVar7 = false, rstr.field_2._8_8_ != 0)) {
          bVar7 = *(long *)(rstr.field_2._8_8_ + 0x48) == 0;
        }
        if (!bVar7) break;
        if ((this->idx != 0) &&
           (uVar2 = this->idx, uVar6 = std::__cxx11::string::length(), uVar2 <= uVar6)) {
          lVar3 = std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)&this->w,lVar3 - this->idx);
        }
        std::
        stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
        ::pop(&this->S);
        bVar7 = std::
                stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
                ::empty(&this->S);
        if (bVar7) {
          if ((this->root == (command_node *)0x0) ||
             (uVar2 = this->root_idx, uVar6 = std::__cxx11::string::length(), uVar6 <= uVar2)) {
            this->idx = 0;
          }
          else {
            lVar3 = std::__cxx11::string::length();
            this->idx = lVar3 - this->root_idx;
          }
        }
        else {
          ppcVar4 = std::
                    stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
                    ::top(&this->S);
          rstr.field_2._8_8_ = *ppcVar4;
          if ((value_type)rstr.field_2._8_8_ == (value_type)0x0) {
            this->idx = 0;
          }
          else {
            sVar5 = std::__cxx11::string::length();
            this->idx = sVar5;
          }
        }
      }
      if ((this->idx != 0) &&
         (uVar2 = this->idx, uVar6 = std::__cxx11::string::length(), uVar2 <= uVar6)) {
        lVar3 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)&this->w,lVar3 - this->idx);
      }
      this->idx = 0;
      bVar7 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::empty(&this->S);
      if ((bVar7) || (rstr.field_2._8_8_ == 0)) {
        std::__cxx11::string::clear();
        this_local._7_1_ = false;
      }
      else {
        rstr.field_2._8_8_ = *(undefined8 *)(rstr.field_2._8_8_ + 0x48);
        std::
        stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
        ::pop(&this->S);
        if (rstr.field_2._8_8_ == 0) {
          this_local._7_1_ = false;
        }
        else {
          std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::push(&this->S,(value_type *)((long)&rstr.field_2 + 8));
          this_local._7_1_ = true;
        }
      }
    }
    else {
      std::
      stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
      ::push(&this->S,(value_type *)(rstr.field_2._8_8_ + 0x38));
      this->idx = 0;
      this_local._7_1_ = true;
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool command_cursor::next()
    {
        // depth first search
        command_node *n = current();
        if (n == NULL)
            return false;

        /*
        if (S.empty())
            LC_LOG_VERBOSE("root[%p]@%zu; w[%s]",root,idx,w.c_str());
        else
            LC_LOG_VERBOSE("n[%p]@%zu; w[%s]",n,idx,w.c_str());
        */

        std::string rstr = remainder();
        if (!rstr.empty()) {
            //LC_LOG_VERBOSE("w + [%s]",rstr.c_str());
            w.append(rstr);
            idx += rstr.length();
            return true;
        }
        else if (n->head != NULL) {
            //LC_LOG_VERBOSE("push[%p;next=%p]",n->head,n->head->next);
            S.push(n->head);
            idx = 0;
            return true;
        }
        else {
            while (!S.empty() && n != NULL && n->next == NULL) {
                if (idx > 0 && idx <= w.length())
                    w.erase(w.length() - idx);

                //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
                S.pop();

                if (S.empty()) {
                    if (root != NULL && root_idx < root->part.length())
                        idx = root->part.length() - root_idx;
                    else
                        idx = 0;
                }
                else {
                    if ((n = S.top()) != NULL)
                        idx = n->part.length();
                    else
                        idx = 0;
                }
            }

            if (idx > 0 && idx <= w.length())
                w.erase(w.length() - idx);

            idx = 0;
            if (S.empty() || n == NULL) {
                w.clear();
                return false;
            }

            n = n->next;
            //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
            S.pop();

            if (n != NULL) {
                //LC_LOG_VERBOSE("push[%p;next=%p]",n,n->next);
                S.push(n);
                return true;
            }
        }
        return false;
    }